

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  cmMakefile *pcVar1;
  static_string_view key_2;
  static_string_view key_2_00;
  static_string_view key_2_01;
  CurrentAndTwoMoreIter args_00;
  CurrentAndTwoMoreIter args_01;
  CurrentAndTwoMoreIter args_02;
  CurrentAndTwoMoreIter args_03;
  CurrentAndTwoMoreIter args_04;
  CurrentAndTwoMoreIter args_05;
  CurrentAndTwoMoreIter args_06;
  CurrentAndTwoMoreIter args_07;
  static_string_view key_3;
  static_string_view key_3_00;
  static_string_view key_3_01;
  static_string_view key_4;
  static_string_view key_4_00;
  static_string_view key_4_01;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view key_1;
  static_string_view key;
  static_string_view key_1_00;
  static_string_view key_00;
  static_string_view key_1_01;
  static_string_view key_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  reference pcVar5;
  string *psVar6;
  string *f2;
  pointer pcVar7;
  ostream *poVar8;
  PolicyID id;
  PolicyID id_00;
  string_view sVar9;
  bool local_af9;
  bool local_ae1;
  bool local_ad2;
  bool local_a81;
  bool local_a71;
  CurrentAndTwoMoreIter local_a60;
  string local_a48;
  string local_a28;
  undefined1 local_a08 [8];
  ostringstream e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  cmCMakePath local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  cmCMakePath local_810;
  undefined1 local_7e1;
  cmValue cStack_7e0;
  bool result_3;
  cmValue rhs_4;
  cmValue lhs_4;
  string local_7c0;
  string local_7a0;
  undefined1 local_780 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d0;
  cmValue local_5b8;
  cmValue rhs_3;
  cmValue lhs_3;
  Status local_57c;
  Status ftcStatus;
  int fileIsNewer;
  cmValue cStack_540;
  bool result_2;
  string *local_538;
  string *rhs_2;
  string *local_528;
  string *lhs_2;
  size_t sStack_518;
  CompareOp op;
  char *local_510;
  size_t local_508;
  char *local_500;
  size_t local_4f8;
  char *local_4f0;
  size_t local_4e8;
  char *local_4e0;
  size_t local_4d8;
  char *local_4d0;
  _List_node_base *local_4c8;
  _List_node_base *local_4c0;
  _List_node_base *local_4b8;
  undefined1 local_4ad;
  int local_4ac;
  bool result_1;
  cmValue cStack_4a8;
  int val;
  cmValue rhs_1;
  cmValue lhs_1;
  undefined1 auStack_428 [7];
  bool result;
  anon_class_32_4_a10dce1b parseDoubles;
  double rhs;
  double lhs;
  cmValue rdef;
  cmValue ldef;
  string local_378 [3];
  bool match;
  undefined1 local_358 [8];
  ostringstream error;
  undefined1 local_1e0 [8];
  RegularExpression regEntry;
  string *rex;
  string_view local_100;
  cmValue local_e0;
  undefined1 local_d8 [8];
  string def_buf;
  cmValue def;
  _Self local_a0;
  _Self local_98;
  _List_node_base *local_90;
  _List_node_base *local_88;
  _List_node_base *local_80;
  size_t local_78;
  char *local_70;
  _Self local_68;
  int local_5c;
  iterator iStack_58;
  int matchNo;
  undefined1 auStack_50 [8];
  CurrentAndTwoMoreIter args;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  args.nextnext._M_node = (_List_node_base *)status;
  cmArgumentList::make3ArgsIterator((CurrentAndTwoMoreIter *)auStack_50,newArgs);
  while( true ) {
    iStack_58 = std::__cxx11::
                list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                          (&newArgs->
                            super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          );
    bVar4 = std::operator!=((_Self *)auStack_50,&stack0xffffffffffffffa8);
    if (!bVar4) break;
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
         end(&newArgs->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
    bVar4 = std::operator!=(&args.current,&local_68);
    local_a71 = false;
    if (bVar4) {
      local_78 = (anonymous_namespace)::keyMATCHES;
      local_70 = DAT_011e04b0;
      pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                         ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
      keyword_03.super_string_view._M_str = local_70;
      keyword_03.super_string_view._M_len = local_78;
      local_a71 = IsKeyword(this,keyword_03,pcVar5);
    }
    if (local_a71 == false) {
      local_98._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(&newArgs->
                  super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>)
      ;
      bVar4 = std::operator==(&args.current,&local_98);
      local_a81 = true;
      if (!bVar4) {
        local_a0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (&newArgs->
                         super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                       );
        local_a81 = std::operator==(&args.next,&local_a0);
      }
      pcVar3 = DAT_011e04b0;
      sVar2 = (anonymous_namespace)::keyMATCHES;
      if (local_a81 == false) {
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
        keyword_02.super_string_view._M_str = pcVar3;
        keyword_02.super_string_view._M_len = sVar2;
        bVar4 = IsKeyword(this,keyword_02,pcVar5);
        if (bVar4) {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                             ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
          def_buf.field_2._8_8_ = GetDefinitionIfUnquoted(this,pcVar5);
          std::__cxx11::string::string((string *)local_d8);
          bVar4 = cmValue::operator_cast_to_bool((cmValue *)((long)&def_buf.field_2 + 8));
          if (bVar4) {
            pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                               ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
            psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar7);
            sVar9 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
            local_100 = sVar9;
            bVar4 = cmHasLiteralPrefix<13ul>(sVar9,(char (*) [13])"CMAKE_MATCH_");
            if (bVar4) {
              psVar6 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&def_buf.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_d8,(string *)psVar6);
              cmValue::cmValue((cmValue *)&rex,(string *)local_d8);
              def_buf.field_2._8_8_ = rex;
            }
          }
          else {
            pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                               ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
            psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar7);
            cmValue::cmValue(&local_e0,psVar6);
            def_buf.field_2._8_8_ = local_e0.Value;
          }
          cmMakefile::ClearMatches(this->Makefile);
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.next);
          regEntry._200_8_ = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar7);
          cmsys::RegularExpression::RegularExpression((RegularExpression *)local_1e0);
          bVar4 = cmsys::RegularExpression::compile
                            ((RegularExpression *)local_1e0,(string *)regEntry._200_8_);
          if (bVar4) {
            psVar6 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&def_buf.field_2 + 8));
            bVar4 = cmsys::RegularExpression::find((RegularExpression *)local_1e0,psVar6);
            if (bVar4) {
              cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_1e0);
            }
            args_01.next._M_node = args.current._M_node;
            args_01.current._M_node = (_List_node_base *)auStack_50;
            args_01.nextnext._M_node = args.next._M_node;
            cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_01);
            bVar4 = false;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
            poVar8 = std::operator<<((ostream *)local_358,"Regular expression \"");
            poVar8 = std::operator<<(poVar8,(string *)regEntry._200_8_);
            std::operator<<(poVar8,"\" cannot compile");
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=((string *)errorString,local_378);
            std::__cxx11::string::~string(local_378);
            *(undefined4 *)&(args.nextnext._M_node)->_M_next = 2;
            this_local._7_1_ = 0;
            bVar4 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
          }
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_1e0);
          std::__cxx11::string::~string((string *)local_d8);
          if (bVar4) goto LAB_00851349;
        }
        else {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
          key_01.super_string_view._M_str = DAT_011e0490;
          key_01.super_string_view._M_len = (anonymous_namespace)::keyLESS;
          key_1_01.super_string_view._M_str = DAT_011e04a0;
          key_1_01.super_string_view._M_len = (anonymous_namespace)::keyLESS_EQUAL;
          key_2.super_string_view._M_str = DAT_011e0420;
          key_2.super_string_view._M_len = (anonymous_namespace)::keyGREATER;
          key_3.super_string_view._M_str = DAT_011e0430;
          key_3.super_string_view._M_len = (anonymous_namespace)::keyGREATER_EQUAL;
          key_4.super_string_view._M_str = DAT_011e0400;
          key_4.super_string_view._M_len = (anonymous_namespace)::keyEQUAL;
          local_5c = matchKeys<cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view>
                               (this,pcVar5,key_01,key_1_01,key_2,key_3,key_4);
          if (local_5c == 0) {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
            key_00.super_string_view._M_str = DAT_011e0540;
            key_00.super_string_view._M_len = (anonymous_namespace)::keySTRLESS;
            key_1_00.super_string_view._M_str = DAT_011e0550;
            key_1_00.super_string_view._M_len = (anonymous_namespace)::keySTRLESS_EQUAL;
            key_2_00.super_string_view._M_str = DAT_011e0520;
            key_2_00.super_string_view._M_len = (anonymous_namespace)::keySTRGREATER;
            key_3_00.super_string_view._M_str = DAT_011e0530;
            key_3_00.super_string_view._M_len = (anonymous_namespace)::keySTRGREATER_EQUAL;
            key_4_00.super_string_view._M_str = DAT_011e0510;
            key_4_00.super_string_view._M_len = (anonymous_namespace)::keySTREQUAL;
            local_5c = matchKeys<cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view>
                                 (this,pcVar5,key_00,key_1_00,key_2_00,key_3_00,key_4_00);
            if (local_5c == 0) {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
              local_4d8 = (anonymous_namespace)::keyVERSION_LESS;
              local_4d0 = DAT_011e05b0;
              local_4e8 = (anonymous_namespace)::keyVERSION_LESS_EQUAL;
              local_4e0 = DAT_011e05c0;
              local_4f8 = (anonymous_namespace)::keyVERSION_GREATER;
              local_4f0 = DAT_011e0590;
              local_508 = (anonymous_namespace)::keyVERSION_GREATER_EQUAL;
              local_500 = DAT_011e05a0;
              sStack_518 = (anonymous_namespace)::keyVERSION_EQUAL;
              local_510 = DAT_011e0580;
              key.super_string_view._M_str = DAT_011e05b0;
              key.super_string_view._M_len = (anonymous_namespace)::keyVERSION_LESS;
              key_1.super_string_view._M_str = DAT_011e05c0;
              key_1.super_string_view._M_len = (anonymous_namespace)::keyVERSION_LESS_EQUAL;
              key_2_01.super_string_view._M_str = DAT_011e0590;
              key_2_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_GREATER;
              key_3_01.super_string_view._M_str = DAT_011e05a0;
              key_3_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_GREATER_EQUAL;
              key_4_01.super_string_view._M_str = DAT_011e0580;
              key_4_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_EQUAL;
              local_5c = matchKeys<cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view>
                                   (this,pcVar5,key,key_1,key_2_01,key_3_01,key_4_01);
              pcVar3 = DAT_011e0470;
              if (local_5c == 0) {
                stack0xfffffffffffffa90 = (anonymous_namespace)::keyIS_NEWER_THAN;
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
                keyword_01.super_string_view._M_str = pcVar3;
                keyword_01.super_string_view._M_len = stack0xfffffffffffffa90;
                bVar4 = IsKeyword(this,keyword_01,pcVar5);
                pcVar3 = DAT_011e0440;
                sVar2 = (anonymous_namespace)::keyIN_LIST;
                if (bVar4) {
                  ftcStatus.Kind_ = Success;
                  pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                     ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
                  psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar7);
                  pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.next);
                  f2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar7);
                  local_57c = cmsys::SystemTools::FileTimeCompare(psVar6,f2,(int *)&ftcStatus);
                  bVar4 = cmsys::Status::operator_cast_to_bool(&local_57c);
                  local_ae1 = true;
                  if ((bVar4) && (local_ae1 = true, ftcStatus.Kind_ != POSIX)) {
                    local_ae1 = ftcStatus.Kind_ == Success;
                  }
                  args_05.next._M_node = args.current._M_node;
                  args_05.current._M_node = (_List_node_base *)auStack_50;
                  args_05.nextnext._M_node = args.next._M_node;
                  cmArgumentList::ReduceTwoArgs(newArgs,local_ae1,args_05);
                }
                else {
                  pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
                  keyword_00.super_string_view._M_str = pcVar3;
                  keyword_00.super_string_view._M_len = sVar2;
                  bVar4 = IsKeyword(this,keyword_00,pcVar5);
                  pcVar3 = DAT_011e05d0;
                  sVar2 = (anonymous_namespace)::keyPATH_EQUAL;
                  if (bVar4) {
                    if ((this->Policy57Status == OLD) || (this->Policy57Status == WARN)) {
                      if (this->Policy57Status == WARN) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_780);
                        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_7a0,(cmPolicies *)0x39,id);
                        poVar8 = std::operator<<((ostream *)local_780,(string *)&local_7a0);
                        std::operator<<(poVar8,
                                        "\nIN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                       );
                        std::__cxx11::string::~string((string *)&local_7a0);
                        pcVar1 = this->Makefile;
                        std::__cxx11::ostringstream::str();
                        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_7c0);
                        std::__cxx11::string::~string((string *)&local_7c0);
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_780);
                      }
                    }
                    else {
                      pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                         ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
                      rhs_3 = GetVariableOrString(this,pcVar5);
                      pcVar1 = this->Makefile;
                      pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                         (&args.next);
                      psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar7);
                      local_5b8 = cmMakefile::GetDefinition(pcVar1,psVar6);
                      bVar4 = cmValue::operator_cast_to_bool(&local_5b8);
                      local_af9 = false;
                      if (bVar4) {
                        psVar6 = cmValue::operator*[abi_cxx11_(&local_5b8);
                        sVar9 = (string_view)
                                std::__cxx11::string::operator_cast_to_basic_string_view
                                          ((string *)psVar6);
                        cmExpandedList_abi_cxx11_(&local_5d0,sVar9,true);
                        psVar6 = cmValue::operator*[abi_cxx11_(&rhs_3);
                        local_af9 = ::cm::
                                    contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                              (&local_5d0,psVar6);
                      }
                      args_06.next._M_node = args.current._M_node;
                      args_06.current._M_node = (_List_node_base *)auStack_50;
                      args_06.nextnext._M_node = args.next._M_node;
                      cmArgumentList::ReduceTwoArgs(newArgs,local_af9,args_06);
                      if (bVar4) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&local_5d0);
                      }
                    }
                  }
                  else {
                    pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                       (&args.current);
                    keyword.super_string_view._M_str = pcVar3;
                    keyword.super_string_view._M_len = sVar2;
                    bVar4 = IsKeyword(this,keyword,pcVar5);
                    if (bVar4) {
                      if ((this->Policy139Status == OLD) || (this->Policy139Status == WARN)) {
                        if (this->Policy139Status == WARN) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a08);
                          cmPolicies::GetPolicyWarning_abi_cxx11_
                                    (&local_a28,(cmPolicies *)0x8b,id_00);
                          poVar8 = std::operator<<((ostream *)local_a08,(string *)&local_a28);
                          std::operator<<(poVar8,
                                          "\nPATH_EQUAL will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                         );
                          std::__cxx11::string::~string((string *)&local_a28);
                          pcVar1 = this->Makefile;
                          std::__cxx11::ostringstream::str();
                          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_a48);
                          std::__cxx11::string::~string((string *)&local_a48);
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a08);
                        }
                      }
                      else {
                        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                           ((_List_iterator<cmExpandedCommandArgument> *)auStack_50)
                        ;
                        rhs_4 = GetVariableOrString(this,pcVar5);
                        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                           (&args.next);
                        cStack_7e0 = GetVariableOrString(this,pcVar5);
                        psVar6 = cmValue::operator*[abi_cxx11_(&rhs_4);
                        std::__cxx11::string::string((string *)&local_830,(string *)psVar6);
                        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                  (&local_810,&local_830,generic_format);
                        psVar6 = cmValue::operator*[abi_cxx11_(&stack0xfffffffffffff820);
                        std::__cxx11::string::string((string *)&local_878,(string *)psVar6);
                        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                  (&local_858,&local_878,generic_format);
                        bVar4 = ::operator==(&local_810,&local_858);
                        cmCMakePath::~cmCMakePath(&local_858);
                        std::__cxx11::string::~string((string *)&local_878);
                        cmCMakePath::~cmCMakePath(&local_810);
                        std::__cxx11::string::~string((string *)&local_830);
                        args_07.next._M_node = args.current._M_node;
                        args_07.current._M_node = (_List_node_base *)auStack_50;
                        args_07.nextnext._M_node = args.next._M_node;
                        local_7e1 = bVar4;
                        cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_07);
                      }
                    }
                  }
                }
              }
              else {
                lhs_2._4_4_ = *(CompareOp *)
                               ((anonymous_namespace)::MATCH2CMPOP + (long)(local_5c + -1) * 4);
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                   ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
                rhs_2 = (string *)GetVariableOrString(this,pcVar5);
                local_528 = cmValue::operator_cast_to_string_((cmValue *)&rhs_2);
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.next);
                cStack_540 = GetVariableOrString(this,pcVar5);
                local_538 = cmValue::operator_cast_to_string_(&stack0xfffffffffffffac0);
                bVar4 = cmSystemTools::VersionCompare(lhs_2._4_4_,local_528,local_538);
                args_04.next._M_node = args.current._M_node;
                args_04.current._M_node = (_List_node_base *)auStack_50;
                args_04.nextnext._M_node = args.next._M_node;
                cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_04);
              }
            }
            else {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                 ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
              rhs_1 = GetVariableOrString(this,pcVar5);
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.next);
              cStack_4a8 = GetVariableOrString(this,pcVar5);
              psVar6 = cmValue::operator*[abi_cxx11_(&rhs_1);
              cmValue::operator*[abi_cxx11_(&stack0xfffffffffffffb58);
              local_4ac = std::__cxx11::string::compare((string *)psVar6);
              local_4ad = anon_unknown.dwarf_11b465a::
                          cmRt2CtSelector<std::less,_std::less_equal,_std::greater,_std::greater_equal,_std::equal_to>
                          ::eval<int>(local_5c,local_4ac,0);
              local_4c8 = (_List_node_base *)auStack_50;
              local_4c0 = args.current._M_node;
              local_4b8 = args.next._M_node;
              args_03.next._M_node = args.current._M_node;
              args_03.current._M_node = (_List_node_base *)auStack_50;
              args_03.nextnext._M_node = args.next._M_node;
              cmArgumentList::ReduceTwoArgs(newArgs,(bool)local_4ad,args_03);
            }
          }
          else {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                               ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
            rdef = GetVariableOrString(this,pcVar5);
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.next);
            lhs = (double)GetVariableOrString(this,pcVar5);
            _auStack_428 = &rdef;
            parseDoubles.ldef = (cmValue *)&rhs;
            parseDoubles.lhs = &lhs;
            parseDoubles.rdef = (cmValue *)&parseDoubles.rhs;
            bVar4 = HandleLevel2::anon_class_32_4_a10dce1b::operator()
                              ((anon_class_32_4_a10dce1b *)auStack_428);
            local_ad2 = false;
            if (bVar4) {
              local_ad2 = anon_unknown.dwarf_11b465a::
                          cmRt2CtSelector<std::less,_std::less_equal,_std::greater,_std::greater_equal,_std::equal_to>
                          ::eval<double>(local_5c,rhs,(double)parseDoubles.rhs);
            }
            args_02.next._M_node = args.current._M_node;
            args_02.current._M_node = (_List_node_base *)auStack_50;
            args_02.nextnext._M_node = args.next._M_node;
            cmArgumentList::ReduceTwoArgs(newArgs,local_ad2,args_02);
          }
        }
      }
    }
    else {
      local_90 = (_List_node_base *)auStack_50;
      local_88 = args.current._M_node;
      local_80 = args.next._M_node;
      args_00.next._M_node = args.current._M_node;
      args_00.current._M_node = (_List_node_base *)auStack_50;
      args_00.nextnext._M_node = args.next._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter>
                (newArgs,false,args_00);
    }
    cmArgumentList::CurrentAndTwoMoreIter::advance
              (&local_a60,(CurrentAndTwoMoreIter *)auStack_50,
               &newArgs->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  }
  this_local._7_1_ = 1;
LAB_00851349:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    // NOTE Handle special case `if(... BLAH_BLAH MATCHES)`
    // (i.e., w/o regex to match which is possibly result of
    // variable expansion to an empty string)
    if (args.next != newArgs.end() &&
        this->IsKeyword(keyMATCHES, *args.current)) {
      newArgs.ReduceOneArg(false, args);
    }

    // NOTE Fail fast: All the binary ops below require 2 arguments.
    else if (args.next == newArgs.end() || args.nextnext == newArgs.end()) {
      continue;
    }

    else if (this->IsKeyword(keyMATCHES, *args.next)) {
      cmValue def = this->GetDefinitionIfUnquoted(*args.current);

      std::string def_buf;
      if (!def) {
        def = cmValue(args.current->GetValue());
      } else if (cmHasLiteralPrefix(args.current->GetValue(),
                                    "CMAKE_MATCH_")) {
        // The string to match is owned by our match result variables.
        // Move it to our own buffer before clearing them.
        def_buf = *def;
        def = cmValue(def_buf);
      }

      this->Makefile.ClearMatches();

      const auto& rex = args.nextnext->GetValue();
      cmsys::RegularExpression regEntry;
      if (!regEntry.compile(rex)) {
        std::ostringstream error;
        error << "Regular expression \"" << rex << "\" cannot compile";
        errorString = error.str();
        status = MessageType::FATAL_ERROR;
        return false;
      }

      const auto match = regEntry.find(*def);
      if (match) {
        this->Makefile.StoreMatches(regEntry);
      }
      newArgs.ReduceTwoArgs(match, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyLESS, keyLESS_EQUAL, keyGREATER,
                                keyGREATER_EQUAL, keyEQUAL))) {

      cmValue ldef = this->GetVariableOrString(*args.current);
      cmValue rdef = this->GetVariableOrString(*args.nextnext);

      double lhs;
      double rhs;
      auto parseDoubles = [&]() {
        return std::sscanf(ldef->c_str(), "%lg", &lhs) == 1 &&
          std::sscanf(rdef->c_str(), "%lg", &rhs) == 1;
      };
      // clang-format off
      const auto result = parseDoubles() &&
        cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo = this->matchKeys(*args.next, keySTRLESS,
                                        keySTRLESS_EQUAL, keySTRGREATER,
                                        keySTRGREATER_EQUAL, keySTREQUAL))) {

      const cmValue lhs = this->GetVariableOrString(*args.current);
      const cmValue rhs = this->GetVariableOrString(*args.nextnext);
      const auto val = (*lhs).compare(*rhs);
      // clang-format off
      const auto result = cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, val, 0);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyVERSION_LESS,
                                keyVERSION_LESS_EQUAL, keyVERSION_GREATER,
                                keyVERSION_GREATER_EQUAL, keyVERSION_EQUAL))) {
      const auto op = MATCH2CMPOP[matchNo - 1];
      const std::string& lhs = this->GetVariableOrString(*args.current);
      const std::string& rhs = this->GetVariableOrString(*args.nextnext);
      const auto result = cmSystemTools::VersionCompare(op, lhs, rhs);
      newArgs.ReduceTwoArgs(result, args);
    }

    // is file A newer than file B
    else if (this->IsKeyword(keyIS_NEWER_THAN, *args.next)) {
      auto fileIsNewer = 0;
      cmsys::Status ftcStatus = cmSystemTools::FileTimeCompare(
        args.current->GetValue(), args.nextnext->GetValue(), &fileIsNewer);
      newArgs.ReduceTwoArgs(
        (!ftcStatus || fileIsNewer == 1 || fileIsNewer == 0), args);
    }

    else if (this->IsKeyword(keyIN_LIST, *args.next)) {

      if (this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->Makefile.GetDefinition(args.nextnext->GetValue());

        newArgs.ReduceTwoArgs(
          rhs && cm::contains(cmExpandedList(*rhs, true), *lhs), args);
      }

      else if (this->Policy57Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057)
          << "\n"
             "IN_LIST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }

    else if (this->IsKeyword(keyPATH_EQUAL, *args.next)) {

      if (this->Policy139Status != cmPolicies::OLD &&
          this->Policy139Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->GetVariableOrString(*args.nextnext);
        const auto result = cmCMakePath{ *lhs } == cmCMakePath{ *rhs };
        newArgs.ReduceTwoArgs(result, args);
      }

      else if (this->Policy139Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0139)
          << "\n"
             "PATH_EQUAL will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }
  }
  return true;
}